

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O3

bool soul::TypeRules::canSilentlyCastTo(Type *dest,Value *value)

{
  bool bVar1;
  double dVar2;
  CastType CVar3;
  Primitive PVar4;
  int32_t iVar5;
  ulong uVar6;
  int64_t iVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  double local_38;
  PackedData local_30;
  
  if ((dest->category == array) && (dest->boundingSize == 0)) {
    return false;
  }
  CVar3 = getCastType(dest,&value->type);
  if ((CVar3 - identity < 8) && ((0xebU >> (CVar3 - identity & 0x1f) & 1) != 0)) {
    return true;
  }
  if (((dest->category & ~primitive) == wrap) &&
     (((value->type).primitiveType.type - int32 < 2 ||
      (((value->type).category & ~primitive) == wrap)))) {
    soul::Value::getData(&local_30,value);
    uVar6 = soul::Value::PackedData::getAsInt64(&local_30);
    if ((dest->category & ~primitive) == wrap) {
      return uVar6 < (ulong)(long)dest->boundingSize && -1 < (long)uVar6;
    }
    throwInternalCompilerError("isBoundedInt()","isValidBoundedIntIndex",0xb1);
  }
  PVar4 = (dest->primitiveType).type;
  if (PVar4 == float32) {
    PVar4 = (value->type).primitiveType.type;
    if (PVar4 != float64) {
LAB_001f3a8e:
      if (1 < PVar4 - int32) {
        return false;
      }
      fVar9 = soul::Value::getAsFloat(value);
      iVar5 = soul::Value::getAsInt32(value);
      fVar10 = (float)iVar5;
      goto LAB_001f3ad1;
    }
    soul::Value::getData(&local_30,value);
    dVar2 = soul::Value::PackedData::getAsDouble(&local_30);
    local_38 = (double)(float)dVar2;
LAB_001f3a38:
    soul::Value::getData(&local_30,value);
    dVar2 = soul::Value::PackedData::getAsDouble(&local_30);
    uVar8 = SUB84(dVar2,0);
    uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    if (PVar4 - int32 < 2) {
      PVar4 = (value->type).primitiveType.type;
      if (PVar4 != float32) {
        if (PVar4 != float64) {
          return false;
        }
        soul::Value::getData(&local_30,value);
        iVar7 = soul::Value::PackedData::getAsInt64(&local_30);
        local_38 = (double)(int)iVar7;
        goto LAB_001f3a38;
      }
      iVar5 = soul::Value::getAsInt32(value);
      fVar9 = (float)iVar5;
      fVar10 = soul::Value::getAsFloat(value);
LAB_001f3ad1:
      bVar1 = fVar10 == fVar9;
      goto LAB_001f3adb;
    }
    if (PVar4 != complex32) {
      return false;
    }
    PVar4 = (value->type).primitiveType.type;
    if (PVar4 != float64) goto LAB_001f3a8e;
    fVar9 = soul::Value::getAsFloat(value);
    local_38 = (double)fVar9;
    dVar2 = soul::Value::getAsDouble(value);
    uVar8 = SUB84(dVar2,0);
    uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  bVar1 = (double)CONCAT44(uVar11,uVar8) == local_38;
LAB_001f3adb:
  return (bool)(-bVar1 & 1);
}

Assistant:

static bool canSilentlyCastTo (const Type& dest, const Value& value)
    {
        const auto& type = value.getType();

        if (dest.isUnsizedArray())
            return false;

        if (canSilentlyCastTo (dest, type))
            return true;

        if (dest.isBoundedInt() && (type.isInteger() || type.isBoundedInt()))
            return dest.isValidBoundedIntIndex (value.getAsInt64());

        if (dest.isFloat32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        if (dest.isInteger())
        {
            if (type.isFloat64())
                return value.getAsInt32() == value.getAsDouble();

            if (type.isFloat32())
                return static_cast<float> (value.getAsInt32()) == value.getAsFloat();
        }

        if (dest.isComplex32())
        {
            if (type.isFloat64())
                return static_cast<double> (value.getAsFloat()) == value.getAsDouble();

            if (type.isInteger())
                return value.getAsFloat() == static_cast<float> (value.getAsInt32());
        }

        return false;
    }